

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,char (*ts_6) [3])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char (*ts_local_2) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_1;
  char (*ts_local) [12];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [12])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,
             (char (*) [3])ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
             (char (*) [3])stream.saved_buffers.stack_storage.aligned_char._184_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
             (char (*) [3])ts_5);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}